

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_chroma_mode2
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  WORD32 idx_v;
  WORD32 idx_u;
  WORD32 intra_pred_ang;
  WORD32 col;
  WORD32 row;
  WORD32 mode_local;
  WORD32 nt_local;
  WORD32 dst_strd_local;
  UWORD8 *pu1_dst_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_ref_local;
  
  for (col = 0; SBORROW4(col,nt * 2) != col + nt * -2 < 0; col = col + 2) {
    for (row = 0; row < nt; row = row + 1) {
      pu1_dst[col + row * dst_strd] = pu1_ref[((nt * 4 + row * -2) - ((col + 1) * 0x20 >> 5)) + -3];
      pu1_dst[col + 1 + row * dst_strd] =
           pu1_ref[((nt * 4 + row * -2) - ((col + 2) * 0x20 >> 5)) + -1];
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode2(UWORD8 *pu1_ref,
                                   WORD32 src_strd,
                                   UWORD8 *pu1_dst,
                                   WORD32 dst_strd,
                                   WORD32 nt,
                                   WORD32 mode)
{
    WORD32 row, col;

    WORD32 intra_pred_ang = 32;
    WORD32 idx_u, idx_v;
    UNUSED(src_strd);
    UNUSED(mode);
    /* For the angle 45, replication is done from the corresponding angle */
    /* intra_pred_ang = tan(angle) in q5 format */
    for(col = 0; col < (2 * nt); col += 2)
    {
        idx_u = ((col + 1) * intra_pred_ang) >> 5; /* Use idx++ */
        idx_v = (((col + 1) + 1) * intra_pred_ang) >> 5; /* Use idx++ */
        for(row = 0; row < nt; row++)
        {
            pu1_dst[col + (row * dst_strd)] = pu1_ref[(4 * nt) - 2 * row - idx_u - 3];
            pu1_dst[(col + 1) + (row * dst_strd)] = pu1_ref[(4 * nt) - 2 * row - idx_v - 1];
        }
    }

}